

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

cmLinkItem * __thiscall
cmGeneratorTarget::ResolveLinkItem
          (cmLinkItem *__return_storage_ptr__,cmGeneratorTarget *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *name
          ,cmLocalGenerator *lg)

{
  bool bVar1;
  TargetType TVar2;
  ostream *poVar3;
  string *psVar4;
  cmake *this_00;
  cmGeneratorTarget *this_01;
  cmListFileBacktrace bt;
  TargetOrString resolved;
  ostringstream w;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_260;
  TargetOrString local_250;
  string local_228;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_208;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1f8;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_1e8;
  string local_1d8;
  string local_1b8;
  ostream local_198;
  
  this_01 = (cmGeneratorTarget *)&name->Backtrace;
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_260,
                 (__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  *)this_01);
  ResolveTargetReference(&local_250,this_01,&name->Value,lg);
  if (local_250.Target == (cmGeneratorTarget *)0x0) {
    std::__cxx11::string::string((string *)&local_1b8,(string *)&local_250);
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_1e8,&local_260);
    cmLinkItem::cmLinkItem
              (__return_storage_ptr__,&local_1b8,false,(cmListFileBacktrace *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
    psVar4 = &local_1b8;
LAB_002dfb90:
    std::__cxx11::string::~string((string *)psVar4);
  }
  else {
    bVar1 = IsDeprecated(local_250.Target);
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
      poVar3 = std::operator<<(&local_198,"The library that is being linked to, ");
      psVar4 = GetName_abi_cxx11_(local_250.Target);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      poVar3 = std::operator<<(poVar3,
                               ", is marked as being deprecated by the owner.  The message provided by the developer is: \n"
                              );
      GetDeprecation_abi_cxx11_(&local_228,local_250.Target);
      poVar3 = std::operator<<(poVar3,(string *)&local_228);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_228);
      this_00 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      std::__cxx11::stringbuf::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_228,(cmListFileBacktrace *)&local_260);
      std::__cxx11::string::~string((string *)&local_228);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    }
    TVar2 = GetType(local_250.Target);
    if (TVar2 == EXECUTABLE) {
      bVar1 = IsExecutableWithExports(local_250.Target);
      if (!bVar1) {
        psVar4 = GetName_abi_cxx11_(local_250.Target);
        std::__cxx11::string::string((string *)&local_1d8,(string *)psVar4);
        std::
        __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr(&local_1f8,&local_260);
        cmLinkItem::cmLinkItem
                  (__return_storage_ptr__,&local_1d8,false,(cmListFileBacktrace *)&local_1f8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1f8._M_refcount);
        psVar4 = &local_1d8;
        goto LAB_002dfb90;
      }
    }
    std::
    __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ::__shared_ptr(&local_208,&local_260);
    cmLinkItem::cmLinkItem
              (__return_storage_ptr__,local_250.Target,false,(cmListFileBacktrace *)&local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
  }
  std::__cxx11::string::~string((string *)&local_250);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_260._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

cmLinkItem cmGeneratorTarget::ResolveLinkItem(BT<std::string> const& name,
                                              cmLocalGenerator const* lg) const
{
  auto bt = name.Backtrace;
  TargetOrString resolved = this->ResolveTargetReference(name.Value, lg);

  if (!resolved.Target) {
    return cmLinkItem(resolved.String, false, bt);
  }

  // Check deprecation, issue message with `bt` backtrace.
  if (resolved.Target->IsDeprecated()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      "The library that is being linked to, "  << resolved.Target->GetName() <<
      ", is marked as being deprecated by the owner.  The message provided by "
      "the developer is: \n" << resolved.Target->GetDeprecation() << "\n";
    /* clang-format on */
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      MessageType::AUTHOR_WARNING, w.str(), bt);
  }

  // Skip targets that will not really be linked.  This is probably a
  // name conflict between an external library and an executable
  // within the project.
  if (resolved.Target->GetType() == cmStateEnums::EXECUTABLE &&
      !resolved.Target->IsExecutableWithExports()) {
    return cmLinkItem(resolved.Target->GetName(), false, bt);
  }

  return cmLinkItem(resolved.Target, false, bt);
}